

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_first_step1.cpp
# Opt level: O0

bool __thiscall
ruckig::PositionFirstOrderStep1::get_profile
          (PositionFirstOrderStep1 *this,Profile *input,Block *block)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  double local_48;
  double vf;
  Profile *p;
  Block *block_local;
  Profile *input_local;
  PositionFirstOrderStep1 *this_local;
  
  Profile::set_boundary(&block->p_min,input);
  if (this->pd <= 0.0) {
    local_48 = this->_vMin;
  }
  else {
    local_48 = this->_vMax;
  }
  pvVar3 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)block,0);
  *pvVar3 = 0.0;
  pvVar3 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)block,1);
  *pvVar3 = 0.0;
  pvVar3 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)block,2);
  *pvVar3 = 0.0;
  dVar1 = this->pd;
  pvVar3 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)block,3);
  *pvVar3 = dVar1 / local_48;
  pvVar3 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)block,4);
  *pvVar3 = 0.0;
  pvVar3 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)block,5);
  *pvVar3 = 0.0;
  pvVar3 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)block,6);
  *pvVar3 = 0.0;
  bVar2 = Profile::
          check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)1>
                    (&block->p_min,local_48);
  if (bVar2) {
    pvVar3 = std::array<double,_7UL>::back(&(block->p_min).t_sum);
    block->t_min = *pvVar3 + (block->p_min).brake.duration + (block->p_min).accel.duration;
  }
  return bVar2;
}

Assistant:

bool PositionFirstOrderStep1::get_profile(const Profile& input, Block& block) {
    auto& p = block.p_min;
    p.set_boundary(input);

    const double vf = (pd > 0) ? _vMax : _vMin;
    p.t[0] = 0;
    p.t[1] = 0;
    p.t[2] = 0;
    p.t[3] = pd / vf;
    p.t[4] = 0;
    p.t[5] = 0;
    p.t[6] = 0;

    if (p.check_for_first_order<Profile::ControlSigns::UDDU, Profile::ReachedLimits::VEL>(vf)) {
        block.t_min = p.t_sum.back() + p.brake.duration + p.accel.duration;
        return true;
    }
    return false;
}